

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createDebugGlobalVariable(Builder *this,Id type,char *name,Id variable)

{
  char *pcVar1;
  Id IVar2;
  Id typeId;
  Instruction *pIVar3;
  value_type local_88;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  Instruction *local_30;
  Instruction *inst;
  char *pcStack_20;
  Id variable_local;
  char *name_local;
  Builder *pBStack_10;
  Id type_local;
  Builder *this_local;
  
  inst._4_4_ = variable;
  pcStack_20 = name;
  name_local._4_4_ = type;
  pBStack_10 = this;
  if (type != 0) {
    pIVar3 = (Instruction *)::operator_new(0x60);
    IVar2 = getUniqueId(this);
    typeId = makeVoidType(this);
    spv::Instruction::Instruction(pIVar3,IVar2,typeId,OpExtInst);
    local_30 = pIVar3;
    spv::Instruction::reserveOperands(pIVar3,0xb);
    spv::Instruction::addIdOperand(local_30,this->nonSemanticShaderDebugInfo);
    spv::Instruction::addImmediateOperand(local_30,0x12);
    pcVar1 = pcStack_20;
    pIVar3 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
    IVar2 = getStringId(this,&local_50);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    spv::Instruction::addIdOperand(local_30,name_local._4_4_);
    pIVar3 = local_30;
    IVar2 = makeDebugSource(this,this->currentFileId);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    pIVar3 = local_30;
    IVar2 = makeUintConstant(this,this->currentLine,false);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    pIVar3 = local_30;
    IVar2 = makeUintConstant(this,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    pIVar3 = local_30;
    IVar2 = makeDebugCompilationUnit(this);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    pcVar1 = pcStack_20;
    pIVar3 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_79);
    IVar2 = getStringId(this,&local_78);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    spv::Instruction::addIdOperand(local_30,inst._4_4_);
    pIVar3 = local_30;
    IVar2 = makeUintConstant(this,8,false);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_88,
               local_30);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_88);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_88);
    Module::mapInstruction(&this->module,local_30);
    IVar2 = spv::Instruction::getResultId(local_30);
    return IVar2;
  }
  __assert_fail("type != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x4b0,
                "Id spv::Builder::createDebugGlobalVariable(const Id, const char *const, const Id)")
  ;
}

Assistant:

Id Builder::createDebugGlobalVariable(Id const type, char const*const name, Id const variable)
{
    assert(type != 0);

    Instruction* inst = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    inst->reserveOperands(11);
    inst->addIdOperand(nonSemanticShaderDebugInfo);
    inst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugGlobalVariable);
    inst->addIdOperand(getStringId(name)); // name id
    inst->addIdOperand(type); // type id
    inst->addIdOperand(makeDebugSource(currentFileId)); // source id
    inst->addIdOperand(makeUintConstant(currentLine)); // line id TODO: currentLine always zero?
    inst->addIdOperand(makeUintConstant(0)); // TODO: column id
    inst->addIdOperand(makeDebugCompilationUnit()); // scope id
    inst->addIdOperand(getStringId(name)); // linkage name id
    inst->addIdOperand(variable); // variable id
    inst->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsDefinition)); // flags id

    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
    module.mapInstruction(inst);

    return inst->getResultId();
}